

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

double pbrt::parseNumber(Token *t)

{
  byte bVar1;
  byte *args;
  size_t __n;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char *__src;
  char *pcVar6;
  long in_FS_OFFSET;
  float fVar7;
  char *endptr;
  char buf [64];
  int local_94;
  double local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  char local_68 [64];
  
  if ((t->token)._M_len == 1) {
    args = (byte *)(t->token)._M_str;
    bVar1 = *args;
    if ((byte)(bVar1 - 0x30) < 10) {
      return (double)(int)(bVar1 - 0x30);
    }
    ErrorExit<char_const&>(&t->loc,"\"%c\": expected a number",(char *)args);
  }
  if ((parseNumber(pbrt::Token_const&)::reg == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parseNumber(pbrt::Token_const&)::reg), iVar2 != 0)) {
    StatRegisterer::StatRegisterer
              ((StatRegisterer *)&parseNumber(pbrt::Token_const&)::reg,
               parseNumber(pbrt::Token_const&)::$_0::__invoke(pbrt::StatsAccumulator__,
               (PixelAccumFunc)0x0);
    __cxa_guard_release(&parseNumber(pbrt::Token_const&)::reg);
  }
  *(long *)(in_FS_OFFSET + -0x4d8) = *(long *)(in_FS_OFFSET + -0x4d8) + 1;
  __n = (t->token)._M_len;
  if (__n - 0x3f < 0xffffffffffffffc0) {
    *(long *)(in_FS_OFFSET + -0x4e0) = *(long *)(in_FS_OFFSET + -0x4e0) + 1;
    pcVar3 = (char *)operator_new__(__n + 1);
    memset(pcVar3,0,__n + 1);
    __src = (t->token)._M_str;
    memmove(pcVar3,__src,__n);
    pcVar3[__n] = '\0';
    pcVar6 = pcVar3;
  }
  else {
    if (__n == 0) {
      pcVar3 = local_68;
      pcVar6 = (char *)0x0;
      local_68[0] = '\0';
      goto LAB_003f3d8f;
    }
    __src = (t->token)._M_str;
    pcVar3 = local_68;
    memmove(pcVar3,__src,__n);
    local_68[__n] = '\0';
    pcVar6 = (char *)0x0;
  }
  local_94 = 0;
  sVar4 = 0;
  do {
    if (9 < (byte)(__src[sVar4] - 0x30U)) {
      fVar7 = double_conversion::StringToDoubleConverter::StringToFloat
                        ((StringToDoubleConverter *)floatParser,pcVar3,(int)__n,&local_94);
      local_90 = (double)fVar7;
      goto LAB_003f3db3;
    }
    sVar4 = sVar4 + 1;
  } while (__n != sVar4);
LAB_003f3d8f:
  local_94 = 0;
  lVar5 = strtol(pcVar3,(char **)&local_88,10);
  local_90 = (double)lVar5;
  local_94 = (int)local_88._M_dataplus._M_p - (int)pcVar3;
LAB_003f3db3:
  if (local_94 != 0) {
    if (pcVar6 != (char *)0x0) {
      operator_delete__(pcVar6);
    }
    return local_90;
  }
  pcVar3 = (t->token)._M_str;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,pcVar3,pcVar3 + (t->token)._M_len);
  ErrorExit<std::__cxx11::string>(&t->loc,"%s: expected a number",&local_88);
}

Assistant:

static double parseNumber(const Token &t) {
    // Fast path for a single digit
    if (t.token.size() == 1) {
        if (!(t.token[0] >= '0' && t.token[0] <= '9'))
            ErrorExit(&t.loc, "\"%c\": expected a number", t.token[0]);
        return t.token[0] - '0';
    }

    // Copy to a buffer so we can NUL-terminate it, as strto[idf]() expect.
    char buf[64];
    char *bufp = buf;
    std::unique_ptr<char[]> allocBuf;
    CHECK_RARE(1e-5, t.token.size() + 1 >= sizeof(buf));
    if (t.token.size() + 1 >= sizeof(buf)) {
        // This should be very unusual, but is necessary in case we get a
        // goofball number with lots of leading zeros, for example.
        allocBuf = std::make_unique<char[]>(t.token.size() + 1);
        bufp = allocBuf.get();
    }

    std::copy(t.token.begin(), t.token.end(), bufp);
    bufp[t.token.size()] = '\0';

    // Can we just use strtol?
    auto isInteger = [](std::string_view str) {
        for (char ch : str)
            if (!(ch >= '0' && ch <= '9'))
                return false;
        return true;
    };

    int length = 0;
    double val;
    if (isInteger(t.token)) {
        char *endptr;
        val = double(strtol(bufp, &endptr, 10));
        length = endptr - bufp;
    } else if (sizeof(Float) == sizeof(float))
        val = floatParser.StringToFloat(bufp, t.token.size(), &length);
    else
        val = floatParser.StringToDouble(bufp, t.token.size(), &length);

    if (length == 0)
        ErrorExit(&t.loc, "%s: expected a number", toString(t.token));

    return val;
}